

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LZString.cpp
# Opt level: O2

wstring * __thiscall
lzstring::LZString::Compress
          (wstring *__return_storage_ptr__,LZString *this,wstring *input,int bitsPerChar,
          GetCharFromIntFunc *func)

{
  int iVar1;
  ulong uVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  iterator iVar6;
  uint *puVar7;
  ulong uVar8;
  int iVar9;
  wchar_t wVar10;
  int __args;
  uint uVar11;
  wchar_t wVar12;
  long lVar13;
  int iVar14;
  bool bVar15;
  double dVar16;
  int local_158;
  int local_154;
  int local_13c;
  wstring contextW;
  wstring contextStr;
  wstring contextWc;
  StringDict contextDict;
  StringFlagDict contextFlagDict;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_50;
  
  uVar2 = input->_M_string_length;
  if (uVar2 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  }
  else {
    contextDict._M_h._M_buckets = &contextDict._M_h._M_single_bucket;
    contextDict._M_h._M_bucket_count = 1;
    contextDict._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    contextDict._M_h._M_element_count = 0;
    contextDict._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    contextDict._M_h._M_rehash_policy._M_next_resize = 0;
    contextDict._M_h._M_single_bucket = (__node_base_ptr)0x0;
    contextFlagDict._M_h._M_buckets = &contextFlagDict._M_h._M_single_bucket;
    contextFlagDict._M_h._M_bucket_count = 1;
    contextWc._M_dataplus._M_p = (pointer)&contextWc.field_2;
    contextWc._M_string_length = 0;
    contextWc.field_2._M_local_buf[0] = L'\0';
    contextW._M_dataplus._M_p = (pointer)&contextW.field_2;
    contextW._M_string_length = 0;
    contextW.field_2._M_local_buf[0] = L'\0';
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    contextFlagDict._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    contextFlagDict._M_h._M_element_count = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
    contextFlagDict._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    contextFlagDict._M_h._M_rehash_policy._M_next_resize = 0;
    contextFlagDict._M_h._M_single_bucket = (__node_base_ptr)0x0;
    iVar9 = bitsPerChar + -1;
    __args = 0;
    local_13c = 3;
    local_158 = 2;
    iVar14 = 0;
    uVar8 = 0;
    local_154 = local_158;
    while( true ) {
      wVar10 = (wchar_t)__return_storage_ptr__;
      if (uVar2 <= uVar8) break;
      wVar12 = (input->_M_dataplus)._M_p[uVar8];
      contextStr._M_dataplus._M_p = (pointer)&contextStr.field_2;
      std::__cxx11::wstring::_M_construct((ulong)&contextStr,L'\x01');
      iVar3 = std::
              _Hashtable<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&contextDict._M_h,&contextStr);
      if (iVar3.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>,_true>
          ._M_cur == (__node_type *)0x0) {
        pmVar4 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&contextDict,&contextStr);
        *pmVar4 = local_13c;
        pmVar5 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&contextFlagDict,&contextStr);
        local_13c = local_13c + 1;
        *pmVar5 = true;
      }
      std::operator+(&local_50,&contextW,wVar12);
      std::__cxx11::wstring::operator=((wstring *)&contextWc,(wstring *)&local_50);
      std::__cxx11::wstring::~wstring((wstring *)&local_50);
      iVar3 = std::
              _Hashtable<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&contextDict._M_h,&contextWc);
      if (iVar3.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>,_true>
          ._M_cur == (__node_type *)0x0) {
        iVar6 = std::
                _Hashtable<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&contextFlagDict._M_h,&contextW);
        if (iVar6.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>,_true>
            ._M_cur == (__node_type *)0x0) {
          puVar7 = (uint *)std::__detail::
                           _Map_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           ::operator[]((_Map_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                         *)&contextDict,&contextW);
          uVar11 = *puVar7;
          lVar13 = (long)local_158;
          while (bVar15 = lVar13 != 0, lVar13 = lVar13 + -1, bVar15) {
            __args = (uVar11 & 1) + __args * 2;
            if (iVar14 == iVar9) {
              std::function<wchar_t_(int)>::operator()(func,__args);
              __args = 0;
              std::__cxx11::wstring::push_back(wVar10);
              iVar14 = 0;
            }
            else {
              iVar14 = iVar14 + 1;
            }
            uVar11 = (int)uVar11 >> 1;
          }
        }
        else {
          lVar13 = (long)local_158;
          if (*contextW._M_dataplus._M_p < L'Ā') {
            while (bVar15 = lVar13 != 0, lVar13 = lVar13 + -1, bVar15) {
              __args = __args * 2;
              if (iVar14 == iVar9) {
                std::function<wchar_t_(int)>::operator()(func,__args);
                __args = 0;
                std::__cxx11::wstring::push_back(wVar10);
                iVar14 = 0;
              }
              else {
                iVar14 = iVar14 + 1;
              }
            }
            wVar12 = *contextW._M_dataplus._M_p;
            lVar13 = 8;
            while (bVar15 = lVar13 != 0, lVar13 = lVar13 + -1, bVar15) {
              __args = (wVar12 & 1U) + __args * 2;
              if (iVar14 == iVar9) {
                std::function<wchar_t_(int)>::operator()(func,__args);
                __args = 0;
                std::__cxx11::wstring::push_back(wVar10);
                iVar14 = 0;
              }
              else {
                iVar14 = iVar14 + 1;
              }
              wVar12 = wVar12 >> 1;
            }
          }
          else {
            iVar1 = 1;
            while (bVar15 = lVar13 != 0, lVar13 = lVar13 + -1, bVar15) {
              __args = iVar1 + __args * 2;
              if (iVar14 == iVar9) {
                std::function<wchar_t_(int)>::operator()(func,__args);
                __args = 0;
                std::__cxx11::wstring::push_back(wVar10);
                iVar14 = 0;
              }
              else {
                iVar14 = iVar14 + 1;
              }
              iVar1 = 0;
            }
            wVar12 = *contextW._M_dataplus._M_p;
            lVar13 = 0x10;
            while (bVar15 = lVar13 != 0, lVar13 = lVar13 + -1, bVar15) {
              __args = (wVar12 & 1U) + __args * 2;
              if (iVar14 == iVar9) {
                std::function<wchar_t_(int)>::operator()(func,__args);
                __args = 0;
                std::__cxx11::wstring::push_back(wVar10);
                iVar14 = 0;
              }
              else {
                iVar14 = iVar14 + 1;
              }
              wVar12 = wVar12 >> 1;
            }
          }
          local_154 = local_154 + -1;
          if (local_154 == 0) {
            dVar16 = ldexp(1.0,local_158);
            local_154 = (int)dVar16;
            local_158 = local_158 + 1;
          }
          std::
          _Hashtable<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::_M_erase(&contextFlagDict._M_h,&contextW);
        }
        local_154 = local_154 + -1;
        if (local_154 == 0) {
          dVar16 = ldexp(1.0,local_158);
          local_154 = (int)dVar16;
          local_158 = local_158 + 1;
        }
        pmVar4 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&contextDict,&contextWc);
        *pmVar4 = local_13c;
        std::__cxx11::wstring::_M_assign((wstring *)&contextW);
        local_13c = local_13c + 1;
      }
      else {
        std::__cxx11::wstring::_M_assign((wstring *)&contextW);
      }
      std::__cxx11::wstring::~wstring((wstring *)&contextStr);
      uVar8 = uVar8 + 1;
      uVar2 = input->_M_string_length;
    }
    if (contextW._M_string_length != 0) {
      iVar6 = std::
              _Hashtable<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&contextFlagDict._M_h,&contextW);
      if (iVar6.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>,_true>
          ._M_cur == (__node_type *)0x0) {
        puVar7 = (uint *)std::__detail::
                         _Map_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         ::operator[]((_Map_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                       *)&contextDict,&contextW);
        uVar11 = *puVar7;
        lVar13 = (long)local_158;
        while (bVar15 = lVar13 != 0, lVar13 = lVar13 + -1, bVar15) {
          __args = (uVar11 & 1) + __args * 2;
          if (iVar14 == iVar9) {
            std::function<wchar_t_(int)>::operator()(func,__args);
            __args = 0;
            std::__cxx11::wstring::push_back(wVar10);
            iVar14 = 0;
          }
          else {
            iVar14 = iVar14 + 1;
          }
          uVar11 = (int)uVar11 >> 1;
        }
      }
      else {
        lVar13 = (long)local_158;
        if (*contextW._M_dataplus._M_p < L'Ā') {
          while (bVar15 = lVar13 != 0, lVar13 = lVar13 + -1, bVar15) {
            __args = __args * 2;
            if (iVar14 == iVar9) {
              std::function<wchar_t_(int)>::operator()(func,__args);
              __args = 0;
              std::__cxx11::wstring::push_back(wVar10);
              iVar14 = 0;
            }
            else {
              iVar14 = iVar14 + 1;
            }
          }
          wVar12 = *contextW._M_dataplus._M_p;
          lVar13 = 8;
          while (bVar15 = lVar13 != 0, lVar13 = lVar13 + -1, bVar15) {
            __args = (wVar12 & 1U) + __args * 2;
            if (iVar14 == iVar9) {
              std::function<wchar_t_(int)>::operator()(func,__args);
              __args = 0;
              std::__cxx11::wstring::push_back(wVar10);
              iVar14 = 0;
            }
            else {
              iVar14 = iVar14 + 1;
            }
            wVar12 = wVar12 >> 1;
          }
        }
        else {
          iVar1 = 1;
          while (bVar15 = lVar13 != 0, lVar13 = lVar13 + -1, bVar15) {
            __args = iVar1 + __args * 2;
            if (iVar14 == iVar9) {
              std::function<wchar_t_(int)>::operator()(func,__args);
              __args = 0;
              std::__cxx11::wstring::push_back(wVar10);
              iVar14 = 0;
            }
            else {
              iVar14 = iVar14 + 1;
            }
            iVar1 = 0;
          }
          wVar12 = *contextW._M_dataplus._M_p;
          lVar13 = 0x10;
          while (bVar15 = lVar13 != 0, lVar13 = lVar13 + -1, bVar15) {
            __args = (wVar12 & 1U) + __args * 2;
            if (iVar14 == iVar9) {
              std::function<wchar_t_(int)>::operator()(func,__args);
              __args = 0;
              std::__cxx11::wstring::push_back(wVar10);
              iVar14 = 0;
            }
            else {
              iVar14 = iVar14 + 1;
            }
            wVar12 = wVar12 >> 1;
          }
        }
        local_154 = local_154 + -1;
        if (local_154 == 0) {
          dVar16 = ldexp(1.0,local_158);
          local_154 = (int)dVar16;
          local_158 = local_158 + 1;
        }
        std::
        _Hashtable<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::_M_erase(&contextFlagDict._M_h,&contextW);
      }
      if (local_154 == 1) {
        ldexp(1.0,local_158);
        local_158 = local_158 + 1;
      }
    }
    lVar13 = (long)local_158;
    uVar11 = 2;
    while (bVar15 = lVar13 != 0, lVar13 = lVar13 + -1, bVar15) {
      __args = (uVar11 & 1) + __args * 2;
      if (iVar14 == iVar9) {
        std::function<wchar_t_(int)>::operator()(func,__args);
        __args = 0;
        std::__cxx11::wstring::push_back(wVar10);
        iVar14 = 0;
      }
      else {
        iVar14 = iVar14 + 1;
      }
      uVar11 = uVar11 >> 1;
    }
    iVar14 = bitsPerChar - iVar14;
    do {
      __args = __args * 2;
      iVar14 = iVar14 + -1;
    } while (iVar14 != 0);
    std::function<wchar_t_(int)>::operator()(func,__args);
    std::__cxx11::wstring::push_back(wVar10);
    std::__cxx11::wstring::~wstring((wstring *)&contextW);
    std::__cxx11::wstring::~wstring((wstring *)&contextWc);
    std::
    _Hashtable<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&contextFlagDict._M_h);
    std::
    _Hashtable<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&contextDict._M_h);
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring LZString::Compress(const std::wstring &input, const int bitsPerChar, GetCharFromIntFunc func)
{
	if (input.empty())
		return std::wstring();

	int i = 0, value = 0;
	StringDict contextDict;
	StringFlagDict contextFlagDict;
	std::wstring contextWc;
	std::wstring contextW;
	int contextEnlargeIn = 2; // Compensate for the first entry which should not count
	int contextDictSize = 3;
	int contextNumBits = 2;
	std::wstring contextData;
	int contextDataVal = 0;
	int contextDataPosition = 0;

	for (size_t index = 0; index < input.size(); index++)
	{
		wchar_t contextC = input[index];
		std::wstring contextStr = std::wstring(1, contextC);
		if (contextDict.find(contextStr) == contextDict.end())
		{
			contextDict[contextStr] = contextDictSize++;
			contextFlagDict[contextStr] = true;
		}

		contextWc = contextW + contextC;
		if (contextDict.find(contextWc) != contextDict.end())
		{
			contextW = contextWc;
		}
		else
		{
			if (contextFlagDict.find(contextW) != contextFlagDict.end())
			{
				if ((int)contextW[0] < 256)
				{
					for (size_t i = 0; i < contextNumBits; i++)
					{
						contextDataVal = (contextDataVal << 1);
						if (contextDataPosition == bitsPerChar - 1)
						{
							contextDataPosition = 0;
							contextData.push_back(func(contextDataVal));
							contextDataVal = 0;
						}
						else
						{
							contextDataPosition++;
						}
					}

					value = contextW[0];
					for (size_t i = 0; i < 8; i++)
					{
						contextDataVal = (contextDataVal << 1) | (value & 1);
						if (contextDataPosition == bitsPerChar - 1)
						{
							contextDataPosition = 0;
							contextData.push_back(func(contextDataVal));
							contextDataVal = 0;
						}
						else
						{
							contextDataPosition++;
						}
						value = value >> 1;
					}
				}
				else
				{
					value = 1;
					for (size_t i = 0; i < contextNumBits; i++)
					{
						contextDataVal = (contextDataVal << 1) | value;
						if (contextDataPosition == bitsPerChar - 1)
						{
							contextDataPosition = 0;
							contextData.push_back(func(contextDataVal));
							contextDataVal = 0;
						}
						else
						{
							contextDataPosition++;
						}
						value = 0;
					}

					value = contextW[0];
					for (size_t i = 0; i < 16; i++)
					{
						contextDataVal = (contextDataVal << 1) | (value & 1);
						if (contextDataPosition == bitsPerChar - 1)
						{
							contextDataPosition = 0;
							contextData.push_back(func(contextDataVal));
							contextDataVal = 0;
						}
						else
						{
							contextDataPosition++;
						}
						value = value >> 1;
					}
				}
				contextEnlargeIn--;
				if (contextEnlargeIn == 0)
				{
					contextEnlargeIn = (int)pow(2, contextNumBits);
					contextNumBits++;
				}
				contextFlagDict.erase(contextW);
			}
			else
			{
				value = contextDict[contextW];
				for (size_t i = 0; i < contextNumBits; i++)
				{
					contextDataVal = (contextDataVal << 1) | (value & 1);
					if (contextDataPosition == bitsPerChar - 1)
					{
						contextDataPosition = 0;
						contextData.push_back(func(contextDataVal));
						contextDataVal = 0;
					}
					else
					{
						contextDataPosition++;
					}
					value = value >> 1;
				}
			}
			contextEnlargeIn--;
			if (contextEnlargeIn == 0)
			{
				contextEnlargeIn = (int)pow(2, contextNumBits);
				contextNumBits++;
			}
			// Add wc to the dictionary
			contextDict[contextWc] = contextDictSize++;
			contextW = contextStr;
		}
	}

	// Output the code for w.
	if (!contextW.empty())
	{
		if (contextFlagDict.find(contextW) != contextFlagDict.end())
		{
			if (contextW[0] < 256)
			{
				for (size_t i = 0; i < contextNumBits; i++)
				{
					contextDataVal = (contextDataVal << 1);
					if (contextDataPosition == bitsPerChar - 1)
					{
						contextDataPosition = 0;
						contextData.push_back(func(contextDataVal));
						contextDataVal = 0;
					}
					else
					{
						contextDataPosition++;
					}
				}
				value = contextW[0];
				for (size_t i = 0; i < 8; i++)
				{
					contextDataVal = (contextDataVal << 1) | (value & 1);
					if (contextDataPosition == bitsPerChar - 1)
					{
						contextDataPosition = 0;
						contextData.push_back(func(contextDataVal));
						contextDataVal = 0;
					}
					else
					{
						contextDataPosition++;
					}
					value = value >> 1;
				}
			}
			else
			{
				value = 1;
				for (size_t i = 0; i < contextNumBits; i++)
				{
					contextDataVal = (contextDataVal << 1) | value;
					if (contextDataPosition == bitsPerChar - 1)
					{
						contextDataPosition = 0;
						contextData.push_back(func(contextDataVal));
						contextDataVal = 0;
					}
					else
					{
						contextDataPosition++;
					}
					value = 0;
				}
				value = contextW[0];
				for (size_t i = 0; i < 16; i++)
				{
					contextDataVal = (contextDataVal << 1) | (value & 1);
					if (contextDataPosition == bitsPerChar - 1)
					{
						contextDataPosition = 0;
						contextData.push_back(func(contextDataVal));
						contextDataVal = 0;
					}
					else
					{
						contextDataPosition++;
					}
					value = value >> 1;
				}
			}
			contextEnlargeIn--;
			if (contextEnlargeIn == 0)
			{
				contextEnlargeIn = (int)pow(2, contextNumBits);
				contextNumBits++;
			}
			contextFlagDict.erase(contextW);
		}
		else
		{
			value = contextDict[contextW];
			for (size_t i = 0; i < contextNumBits; i++)
			{
				contextDataVal = (contextDataVal << 1) | (value & 1);
				if (contextDataPosition == bitsPerChar - 1)
				{
					contextDataPosition = 0;
					contextData.push_back(func(contextDataVal));
					contextDataVal = 0;
				}
				else
				{
					contextDataPosition++;
				}
				value = value >> 1;
			}
		}

		contextEnlargeIn--;
		if (contextEnlargeIn == 0)
		{
			contextEnlargeIn = (int)pow(2, contextNumBits);
			contextNumBits++;
		}
	}

	// Mark the end of the stream
	value = 2;
	for (size_t i = 0; i < contextNumBits; i++)
	{
		contextDataVal = (contextDataVal << 1) | (value & 1);
		if (contextDataPosition == bitsPerChar - 1)
		{
			contextDataPosition = 0;
			contextData.push_back(func(contextDataVal));
			contextDataVal = 0;
		}
		else
		{
			contextDataPosition++;
		}
		value = value >> 1;
	}

	// Flush the last char
	while (true)
	{
		contextDataVal = (contextDataVal << 1);
		if (contextDataPosition == bitsPerChar - 1)
		{
			contextData.push_back(func(contextDataVal));
			break;
		}
		else
		{
			contextDataPosition++;
		}
	}

	return contextData;
}